

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O1

int ttf_text_length(ALLEGRO_FONT *f,ALLEGRO_USTR *text)

{
  uint in_EAX;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int pos;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  iVar1 = al_ustr_get_next(text);
  if (iVar1 < 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      iVar2 = al_ustr_get_next(text,(long)&uStack_38 + 4);
      iVar3 = -1;
      if (-1 < iVar2) {
        iVar3 = iVar2;
      }
      iVar1 = al_get_glyph_advance(f,iVar1,iVar3);
      iVar4 = iVar4 + iVar1;
      iVar1 = iVar2;
    } while (-1 < iVar2);
  }
  return iVar4;
}

Assistant:

static int ttf_text_length(ALLEGRO_FONT const *f, const ALLEGRO_USTR *text)
{
   int pos = 0;
   int x = 0;
   int32_t ch, nch;

   nch = al_ustr_get_next(text, &pos);
   while (nch >= 0) {
      ch = nch;
      nch = al_ustr_get_next(text, &pos);

      x += al_get_glyph_advance(f, ch, nch < 0 ?
         ALLEGRO_NO_KERNING : nch);
   }

   return x;
}